

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O1

Value * cmFileAPICodemodelDump
                  (Value *__return_storage_ptr__,cmFileAPI *fileAPI,unsigned_long version)

{
  _Head_base<0UL,_cmGlobalGenerator_*,_false> _Var1;
  pointer puVar2;
  pointer pcVar3;
  string *psVar4;
  Value *pVVar5;
  pointer pbVar6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1b8;
  Value local_1a0;
  Value local_178;
  ValueHolder local_150;
  unsigned_long local_148;
  pointer local_140;
  char *local_138 [2];
  char local_128 [16];
  char *local_118 [2];
  char local_108 [24];
  _Rb_tree_node_base local_f0;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  _Rb_tree_node_base local_a8;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  __node_base_ptr *local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined4 local_48;
  undefined8 local_40;
  __node_base_ptr p_Stack_38;
  
  Json::Value::Value(__return_storage_ptr__,objectValue);
  Json::Value::Value(&local_1a0,objectValue);
  psVar4 = cmake::GetHomeDirectory_abi_cxx11_(fileAPI->CMakeInstance);
  Json::Value::Value((Value *)&local_150,psVar4);
  pVVar5 = Json::Value::operator[](&local_1a0,"source");
  Json::Value::operator=(pVVar5,(Value *)&local_150);
  Json::Value::~Value((Value *)&local_150);
  psVar4 = cmake::GetHomeOutputDirectory_abi_cxx11_(fileAPI->CMakeInstance);
  Json::Value::Value((Value *)&local_150,psVar4);
  pVVar5 = Json::Value::operator[](&local_1a0,"build");
  Json::Value::operator=(pVVar5,(Value *)&local_150);
  Json::Value::~Value((Value *)&local_150);
  pVVar5 = Json::Value::operator[](__return_storage_ptr__,"paths");
  Json::Value::operator=(pVVar5,&local_1a0);
  Json::Value::~Value(&local_1a0);
  Json::Value::Value(&local_178,arrayValue);
  _Var1._M_head_impl =
       (fileAPI->CMakeInstance->GlobalGenerator)._M_t.
       super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>._M_t.
       super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
       super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl;
  puVar2 = *(pointer *)
            &((_Var1._M_head_impl)->Makefiles).
             super__Vector_base<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
  ;
  if (puVar2 != *(pointer *)((long)&(_Var1._M_head_impl)->Makefiles + 8)) {
    cmMakefile::GetGeneratorConfigs_abi_cxx11_
              (&local_1b8,(cmMakefile *)puVar2->_M_t,IncludeEmptyConfig);
    if (local_1b8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_1b8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pbVar6 = local_1b8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        local_150 = (ValueHolder)fileAPI;
        local_148 = version;
        local_140 = pbVar6;
        psVar4 = cmake::GetHomeDirectory_abi_cxx11_(fileAPI->CMakeInstance);
        local_138[0] = local_128;
        pcVar3 = (psVar4->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_138,pcVar3,pcVar3 + psVar4->_M_string_length);
        psVar4 = cmake::GetHomeOutputDirectory_abi_cxx11_(*(cmake **)local_150.string_);
        local_118[0] = local_108;
        pcVar3 = (psVar4->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_118,pcVar3,pcVar3 + psVar4->_M_string_length);
        local_f0._M_color = _S_red;
        local_f0._M_parent = (_Base_ptr)0x0;
        local_f0._M_left = &local_f0;
        local_a8._M_color = _S_red;
        local_a8._M_parent = (_Base_ptr)0x0;
        local_c0 = 0;
        uStack_b8 = 0;
        local_d0 = 0;
        uStack_c8 = 0;
        local_a8._M_left = &local_a8;
        local_78 = 0;
        uStack_70 = 0;
        local_88 = 0;
        uStack_80 = 0;
        local_68 = &p_Stack_38;
        local_60 = 1;
        local_58 = 0;
        uStack_50 = 0;
        local_48 = 0x3f800000;
        local_40 = 0;
        p_Stack_38 = (__node_base_ptr)0x0;
        local_f0._M_right = local_f0._M_left;
        local_a8._M_right = local_a8._M_left;
        anon_unknown.dwarf_1ca509f::CodemodelConfig::Dump(&local_1a0,(CodemodelConfig *)&local_150);
        anon_unknown.dwarf_1ca509f::CodemodelConfig::~CodemodelConfig((CodemodelConfig *)&local_150)
        ;
        Json::Value::append(&local_178,&local_1a0);
        Json::Value::~Value(&local_1a0);
        pbVar6 = pbVar6 + 1;
      } while (pbVar6 != local_1b8.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1b8);
  }
  pVVar5 = Json::Value::operator[](__return_storage_ptr__,"configurations");
  Json::Value::operator=(pVVar5,&local_178);
  Json::Value::~Value(&local_178);
  return __return_storage_ptr__;
}

Assistant:

Json::Value cmFileAPICodemodelDump(cmFileAPI& fileAPI, unsigned long version)
{
  Codemodel codemodel(fileAPI, version);
  return codemodel.Dump();
}